

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodePreviewDockSetup
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data,bool is_explicit_target,bool is_outer_docking)

{
  int iVar1;
  ImGuiDockNode *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  ulong uVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  ImGuiDockNode *pIVar9;
  ushort uVar10;
  uint uVar11;
  ImVec2 *pIVar12;
  ImVec2 *pIVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ImVec2 size_new;
  ImVec2 pos_old;
  ImVec2 pos_new;
  ImVec2 size_old;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  
  pIVar3 = GImGui;
  pIVar9 = host_node;
  if ((host_node != (ImGuiDockNode *)0x0) && (pIVar2 = host_node, (host_node->field_0xb9 & 2) == 0))
  {
    do {
      pIVar9 = pIVar2;
      pIVar2 = pIVar9->ParentNode;
    } while (pIVar9->ParentNode != (ImGuiDockNode *)0x0);
  }
  pIVar2 = root_payload->DockNodeAsHost;
  if ((pIVar9 != (ImGuiDockNode *)0x0) && ((pIVar9->field_0xb9 & 2) == 0)) {
    __assert_fail("ref_node_for_rect->IsVisible",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3583,
                  "void ImGui::DockNodePreviewDockSetup(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, ImGuiDockPreviewData *, bool, bool)"
                 );
  }
  if (pIVar2 == (ImGuiDockNode *)0x0) {
    uVar11 = (root_payload->WindowClass).DockNodeFlagsOverrideSet;
  }
  else {
    uVar11 = pIVar2->LocalFlags | pIVar2->SharedFlags;
  }
  if (host_node == (ImGuiDockNode *)0x0) {
    uVar7 = (host_window->WindowClass).DockNodeFlagsOverrideSet;
  }
  else {
    uVar7 = host_node->LocalFlags | host_node->SharedFlags;
  }
  data->IsCenterAvailable = true;
  if (((!is_outer_docking) && ((uVar7 & 0x10000) == 0)) &&
     ((host_node == (ImGuiDockNode *)0x0 ||
      (((uVar7 & 4) == 0 || ((host_node->LocalFlags & 0x800) == 0)))))) {
    if (host_node == (ImGuiDockNode *)0x0) {
      if (pIVar2 != (ImGuiDockNode *)0x0) goto LAB_0013e18a;
    }
    else if ((pIVar2 != (ImGuiDockNode *)0x0) &&
            (host_node->ChildNodes[0] != (ImGuiDockNode *)0x0 || (host_node->Windows).Size != 0)) {
LAB_0013e18a:
      if ((pIVar2->ChildNodes[0] != (ImGuiDockNode *)0x0) &&
         (pIVar2->OnlyNodeWithWindows == (ImGuiDockNode *)0x0)) goto LAB_0013e1b2;
    }
    if ((uVar11 & 0x100000) == 0 && (uVar7 & 0x80000) == 0) goto LAB_0013e1b9;
  }
LAB_0013e1b2:
  data->IsCenterAvailable = false;
LAB_0013e1b9:
  data->IsSidesAvailable = true;
  if (((((uVar7 & 0x10) != 0) || ((pIVar3->IO).ConfigDockingNoSplit != false)) ||
      ((host_node != (ImGuiDockNode *)0x0 && !is_outer_docking &&
       ((host_node->ParentNode == (ImGuiDockNode *)0x0 && ((host_node->LocalFlags & 0x800) != 0)))))
      ) || ((uVar11 & 0x40000) != 0 || (uVar7 & 0x20000) != 0)) {
    data->IsSidesAvailable = false;
  }
  if (host_node == (ImGuiDockNode *)0x0) {
    bVar5 = host_window->HasCloseButton;
  }
  else {
    bVar5 = (host_node->field_0xb9 & 8) >> 3;
  }
  uVar10 = 0x800;
  if (bVar5 == 0) {
    iVar1._0_1_ = root_payload->HasCloseButton;
    iVar1._1_1_ = root_payload->ResizeBorderHeld;
    iVar1._2_2_ = root_payload->BeginCount;
    uVar10 = (ushort)(iVar1 << 0xb);
  }
  uVar10 = uVar10 | (ushort)*(undefined4 *)&(data->FutureNode).field_0xb8 & 0xf7ff;
  *(ushort *)&(data->FutureNode).field_0xb8 = uVar10;
  uVar6 = 0x1000;
  if (host_node == (ImGuiDockNode *)0x0) {
    uVar6 = (ushort)((~host_window->Flags & 0x20U) << 7);
  }
  pIVar12 = &pIVar9->Pos;
  if (pIVar9 == (ImGuiDockNode *)0x0) {
    pIVar12 = &host_window->Pos;
  }
  *(ushort *)&(data->FutureNode).field_0xb8 = uVar6 | uVar10 & 0xefff;
  pIVar13 = &host_window->Size;
  if (pIVar9 != (ImGuiDockNode *)0x0) {
    pIVar13 = &pIVar9->Size;
  }
  (data->FutureNode).Pos = *pIVar12;
  (data->FutureNode).Size = *pIVar13;
  data->SplitNode = host_node;
  data->SplitDir = -1;
  data->IsSplitDirExplicit = false;
  if (host_window->Collapsed == false) {
    uVar11 = 0xffffffff;
    lVar8 = 0;
    do {
      bVar15 = lVar8 == 0;
      if (bVar15) {
        if (data->IsCenterAvailable != false) goto LAB_0013e31a;
      }
      else {
        if (data->IsSidesAvailable != true) goto LAB_0013e652;
LAB_0013e31a:
        fVar17 = (data->FutureNode).Pos.x;
        fVar18 = (data->FutureNode).Pos.y;
        fVar24 = (data->FutureNode).Size.x + fVar17;
        fVar23 = (data->FutureNode).Size.y + fVar18;
        fVar20 = fVar24 - fVar17;
        fVar19 = fVar23 - fVar18;
        fVar16 = fVar20;
        if (fVar19 <= fVar20) {
          fVar16 = fVar19;
        }
        fVar21 = pIVar3->FontSize * 1.5;
        fVar22 = pIVar3->FontSize * 0.5;
        uVar7 = -(uint)(fVar16 * 0.125 <= fVar22);
        fVar16 = (float)(uVar7 & (uint)fVar22 | ~uVar7 & (uint)(fVar16 * 0.125));
        if (fVar16 <= fVar21) {
          fVar21 = fVar16;
        }
        if (is_outer_docking) {
          fVar22 = (float)(int)(fVar21 * 1.5);
          fVar21 = (float)(int)(fVar21 * 0.8);
          fVar19 = (float)(int)(fVar19 * 0.5 - fVar21);
          fVar16 = (float)(int)(fVar20 * 0.5 - fVar21);
        }
        else {
          fVar22 = (float)(int)fVar21;
          fVar21 = (float)(int)(fVar21 * 0.9);
          fVar19 = (float)(int)(fVar22 * 2.4);
          fVar16 = fVar19;
        }
        fVar17 = (float)(int)((fVar17 + fVar24) * 0.5);
        fVar18 = (float)(int)((fVar18 + fVar23) * 0.5);
        if (lVar8 == 0) {
          fVar20 = fVar17 - fVar22;
          fVar16 = fVar22 + fVar17;
LAB_0013e475:
          fVar23 = fVar18 - fVar22;
          fVar21 = fVar22 + fVar18;
          goto LAB_0013e4fa;
        }
        switch(uVar11) {
        case 0:
          fVar20 = (fVar17 - fVar16) - fVar21;
          fVar16 = (fVar17 - fVar16) + fVar21;
          goto LAB_0013e475;
        case 1:
          fVar20 = (fVar16 + fVar17) - fVar21;
          fVar23 = fVar18 - fVar22;
          fVar16 = fVar16 + fVar17 + fVar21;
          fVar21 = fVar22 + fVar18;
          break;
        case 2:
          fVar20 = fVar17 - fVar22;
          fVar23 = (fVar18 - fVar19) - fVar21;
          fVar16 = fVar22 + fVar17;
          fVar21 = (fVar18 - fVar19) + fVar21;
          break;
        case 3:
          fVar20 = fVar17 - fVar22;
          fVar23 = (fVar19 + fVar18) - fVar21;
          fVar16 = fVar22 + fVar17;
          fVar21 = fVar19 + fVar18 + fVar21;
          break;
        default:
          goto switchD_0013e437_default;
        }
LAB_0013e4fa:
        *(float *)((long)&data->DropRectsDraw[0].Min.x + lVar8) = fVar20;
        *(float *)((long)&data->DropRectsDraw[0].Min.y + lVar8) = fVar23;
        *(float *)((long)&data->DropRectsDraw[0].Max.x + lVar8) = fVar16;
        *(float *)((long)&data->DropRectsDraw[0].Max.y + lVar8) = fVar21;
switchD_0013e437_default:
        fVar16 = *(float *)((long)&data->DropRectsDraw[0].Min.x + lVar8);
        fVar19 = *(float *)((long)&data->DropRectsDraw[0].Min.y + lVar8);
        fVar20 = *(float *)((long)&data->DropRectsDraw[0].Max.x + lVar8);
        fVar23 = *(float *)((long)&data->DropRectsDraw[0].Max.y + lVar8);
        if (is_outer_docking) {
LAB_0013e60d:
          fVar17 = (pIVar3->IO).MousePos.x;
          if (fVar17 < fVar16) goto LAB_0013e652;
          fVar18 = (pIVar3->IO).MousePos.y;
          bVar15 = fVar18 < fVar23 && (fVar19 <= fVar18 && fVar17 < fVar20);
        }
        else {
          fVar17 = (pIVar3->IO).MousePos.x - fVar17;
          fVar18 = (pIVar3->IO).MousePos.y - fVar18;
          fVar24 = fVar17 * fVar17 + fVar18 * fVar18;
          if (fVar24 < fVar22 * 1.4 * fVar22 * 1.4) {
LAB_0013e5ed:
            bVar14 = false;
          }
          else {
            bVar14 = true;
            if (fVar24 < fVar22 * 2.6 * fVar22 * 2.6) {
              uVar7 = (uint)(0.0 < fVar17);
              if (ABS(fVar17) <= ABS(fVar18)) {
                uVar7 = 0.0 < fVar18 | 2;
              }
              bVar15 = uVar11 == uVar7;
              goto LAB_0013e5ed;
            }
          }
          if (bVar14) {
            fVar17 = (float)(int)(fVar22 * 0.3);
            fVar16 = fVar16 - fVar17;
            fVar19 = fVar19 - fVar17;
            fVar20 = fVar20 + fVar17;
            fVar23 = fVar23 + fVar17;
            goto LAB_0013e60d;
          }
        }
        if (bVar15) {
          data->SplitDir = uVar11;
          data->IsSplitDirExplicit = true;
        }
      }
LAB_0013e652:
      lVar8 = lVar8 + 0x10;
      uVar11 = uVar11 + 1;
    } while (lVar8 != 0x50);
  }
  uVar11 = data->SplitDir;
  bVar15 = true;
  if (uVar11 == 0xffffffff) {
    bVar15 = data->IsCenterAvailable;
  }
  data->IsDropAllowed = bVar15;
  if (((!is_explicit_target) && (data->IsSplitDirExplicit == false)) &&
     ((pIVar3->IO).ConfigDockingWithShift == false)) {
    data->IsDropAllowed = false;
  }
  data->SplitRatio = 0.0;
  if (uVar11 != 0xffffffff) {
    bVar14 = uVar11 < 2;
    bVar15 = !bVar14;
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_48 = (data->FutureNode).Pos;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_38 = (data->FutureNode).Size;
    local_30 = root_payload->Size;
    fVar17 = (pIVar3->Style).ItemInnerSpacing.x;
    (&local_40.x)[bVar14] = (&local_48.x)[bVar14];
    (&local_50.x)[bVar14] = (&local_38.x)[bVar14];
    uVar4 = (ulong)((uint)bVar15 * 4);
    fVar16 = *(float *)((long)&local_38.x + uVar4) - fVar17;
    fVar18 = *(float *)((long)&local_30.x + uVar4);
    fVar19 = fVar16 * 0.5;
    if (fVar18 <= 0.0 || fVar19 < fVar18) {
      fVar18 = (float)(int)fVar19;
    }
    *(float *)((long)&local_50.x + uVar4) = fVar18;
    fVar18 = (float)(int)(fVar16 - fVar18);
    *(float *)((long)&local_38.x + uVar4) = fVar18;
    uVar11 = uVar11 & 0xfffffffd;
    if (uVar11 == 0) {
      uVar4 = (ulong)((uint)bVar15 * 4);
      fVar18 = *(float *)((long)&local_48.x + uVar4);
      *(float *)((long)&local_40.x + uVar4) = fVar18;
      *(float *)((long)&local_48.x + uVar4) =
           fVar17 + fVar18 + *(float *)((long)&local_50.x + uVar4);
    }
    else if (uVar11 == 1) {
      *(float *)((long)&local_40.x + (ulong)((uint)bVar15 * 4)) =
           fVar17 + fVar18 + *(float *)((long)&local_48.x + (ulong)((uint)bVar15 * 4));
    }
    fVar18 = (&local_50.x)[bVar15] /
             *(float *)((long)(data->FutureNode).ChildNodes + (ulong)bVar15 * 4 + 0x30);
    fVar17 = 1.0;
    if (fVar18 <= 1.0) {
      fVar17 = fVar18;
    }
    fVar17 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar17);
    (data->FutureNode).Pos = local_40;
    (data->FutureNode).Size = local_50;
    if (uVar11 == 1) {
      fVar17 = 1.0 - fVar17;
    }
    data->SplitRatio = fVar17;
  }
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockSetup(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, ImGuiDockPreviewData* data, bool is_explicit_target, bool is_outer_docking)
{
    ImGuiContext& g = *GImGui;

    // There is an edge case when docking into a dockspace which only has inactive nodes.
    // In this case DockNodeTreeFindNodeByPos() will have selected a leaf node which is inactive.
    // Because the inactive leaf node doesn't have proper pos/size yet, we'll use the root node as reference.
    ImGuiDockNode* root_payload_as_host = root_payload->DockNodeAsHost;
    ImGuiDockNode* ref_node_for_rect = (host_node && !host_node->IsVisible) ? DockNodeGetRootNode(host_node) : host_node;
    if (ref_node_for_rect)
        IM_ASSERT(ref_node_for_rect->IsVisible);

    // Filter, figure out where we are allowed to dock
    ImGuiDockNodeFlags src_node_flags = root_payload_as_host ? root_payload_as_host->GetMergedFlags() : root_payload->WindowClass.DockNodeFlagsOverrideSet;
    ImGuiDockNodeFlags dst_node_flags = host_node ? host_node->GetMergedFlags() : host_window->WindowClass.DockNodeFlagsOverrideSet;
    data->IsCenterAvailable = true;
    if (is_outer_docking)
        data->IsCenterAvailable = false;
    else if (dst_node_flags & ImGuiDockNodeFlags_NoDocking)
        data->IsCenterAvailable = false;
    else if (host_node && (dst_node_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) && host_node->IsCentralNode())
        data->IsCenterAvailable = false;
    else if ((!host_node || !host_node->IsEmpty()) && root_payload_as_host && root_payload_as_host->IsSplitNode() && (root_payload_as_host->OnlyNodeWithWindows == NULL)) // Is _visibly_ split?
        data->IsCenterAvailable = false;
    else if ((dst_node_flags & ImGuiDockNodeFlags_NoDockingOverMe) || (src_node_flags & ImGuiDockNodeFlags_NoDockingOverOther))
        data->IsCenterAvailable = false;

    data->IsSidesAvailable = true;
    if ((dst_node_flags & ImGuiDockNodeFlags_NoSplit) || g.IO.ConfigDockingNoSplit)
        data->IsSidesAvailable = false;
    else if (!is_outer_docking && host_node && host_node->ParentNode == NULL && host_node->IsCentralNode())
        data->IsSidesAvailable = false;
    else if ((dst_node_flags & ImGuiDockNodeFlags_NoDockingSplitMe) || (src_node_flags & ImGuiDockNodeFlags_NoDockingSplitOther))
        data->IsSidesAvailable = false;

    // Build a tentative future node (reuse same structure because it is practical. Shape will be readjusted when previewing a split)
    data->FutureNode.HasCloseButton = (host_node ? host_node->HasCloseButton : host_window->HasCloseButton) || (root_payload->HasCloseButton);
    data->FutureNode.HasWindowMenuButton = host_node ? true : ((host_window->Flags & ImGuiWindowFlags_NoCollapse) == 0);
    data->FutureNode.Pos = ref_node_for_rect ? ref_node_for_rect->Pos : host_window->Pos;
    data->FutureNode.Size = ref_node_for_rect ? ref_node_for_rect->Size : host_window->Size;

    // Calculate drop shapes geometry for allowed splitting directions
    IM_ASSERT(ImGuiDir_None == -1);
    data->SplitNode = host_node;
    data->SplitDir = ImGuiDir_None;
    data->IsSplitDirExplicit = false;
    if (!host_window->Collapsed)
        for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
        {
            if (dir == ImGuiDir_None && !data->IsCenterAvailable)
                continue;
            if (dir != ImGuiDir_None && !data->IsSidesAvailable)
                continue;
            if (DockNodeCalcDropRectsAndTestMousePos(data->FutureNode.Rect(), (ImGuiDir)dir, data->DropRectsDraw[dir+1], is_outer_docking, &g.IO.MousePos))
            {
                data->SplitDir = (ImGuiDir)dir;
                data->IsSplitDirExplicit = true;
            }
        }

    // When docking without holding Shift, we only allow and preview docking when hovering over a drop rect or over the title bar
    data->IsDropAllowed = (data->SplitDir != ImGuiDir_None) || (data->IsCenterAvailable);
    if (!is_explicit_target && !data->IsSplitDirExplicit && !g.IO.ConfigDockingWithShift)
        data->IsDropAllowed = false;

    // Calculate split area
    data->SplitRatio = 0.0f;
    if (data->SplitDir != ImGuiDir_None)
    {
        ImGuiDir split_dir = data->SplitDir;
        ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        ImVec2 pos_new, pos_old = data->FutureNode.Pos;
        ImVec2 size_new, size_old = data->FutureNode.Size;
        DockNodeCalcSplitRects(pos_old, size_old, pos_new, size_new, split_dir, root_payload->Size);

        // Calculate split ratio so we can pass it down the docking request
        float split_ratio = ImSaturate(size_new[split_axis] / data->FutureNode.Size[split_axis]);
        data->FutureNode.Pos = pos_new;
        data->FutureNode.Size = size_new;
        data->SplitRatio = (split_dir == ImGuiDir_Right || split_dir == ImGuiDir_Down) ? (1.0f - split_ratio) : (split_ratio);
    }
}